

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O1

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Initialize<spoa::InstructionSet<(spoa::Architecture)3,int>>
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,char *sequence,Graph *graph,
          uint64_t normal_matrix_width,uint64_t matrix_width,uint64_t matrix_height)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  AlignmentSubtype AVar6;
  int iVar7;
  AlignmentType AVar8;
  pointer ppNVar9;
  long lVar10;
  __mxxxi *palVar11;
  Implementation *pIVar12;
  Node *pNVar13;
  pointer ppEVar14;
  undefined4 *puVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  int *piVar21;
  char cVar22;
  int iVar24;
  ulong uVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  long lVar29;
  pointer ppEVar30;
  byte bVar31;
  uint uVar32;
  const_iterator __end4;
  const_iterator __end5;
  ulong uVar33;
  const_iterator __begin4;
  bool bVar34;
  __mxxxi alVar35;
  undefined1 auVar36 [32];
  type unpacked [8];
  ulong local_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  int iVar23;
  
  bVar3 = (this->super_AlignmentEngine).m_;
  bVar31 = (this->super_AlignmentEngine).n_;
  bVar26 = (char)bVar3 >> 7;
  bVar26 = (bVar3 ^ bVar26) - bVar26;
  bVar27 = (char)bVar31 >> 7;
  bVar27 = (bVar31 ^ bVar27) - bVar27;
  bVar3 = (this->super_AlignmentEngine).g_;
  bVar28 = (char)bVar3 >> 7;
  bVar28 = (bVar3 ^ bVar28) - bVar28;
  bVar3 = (this->super_AlignmentEngine).q_;
  bVar31 = (char)bVar3 >> 7;
  bVar31 = (bVar3 ^ bVar31) - bVar31;
  if (bVar27 < bVar26) {
    bVar27 = bVar26;
  }
  if (bVar31 < bVar28) {
    bVar31 = bVar28;
  }
  uVar20 = (uint)bVar31;
  if ((uint)bVar31 < (uint)bVar27) {
    uVar20 = (uint)bVar27;
  }
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  if (graph->num_codes_ != 0) {
    local_88 = 0;
    do {
      if (matrix_width != 0) {
        iVar24 = (graph->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_88 & 0xff];
        uVar32 = 0;
        uVar25 = 0;
        do {
          uVar33 = (ulong)uVar32;
          cVar4 = (this->super_AlignmentEngine).m_;
          cVar5 = (this->super_AlignmentEngine).n_;
          lVar29 = 0;
          do {
            iVar23 = -uVar20;
            if (uVar33 < normal_matrix_width) {
              cVar22 = cVar4;
              if (sequence[uVar33] != (char)iVar24) {
                cVar22 = cVar5;
              }
              iVar23 = (int)cVar22;
            }
            *(int *)((long)&local_80 + lVar29) = iVar23;
            lVar29 = lVar29 + 4;
            uVar33 = uVar33 + 1;
          } while (lVar29 != 0x20);
          palVar11 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->sequence_profile + local_88 * matrix_width + uVar25;
          (*palVar11)[0] = local_80;
          (*palVar11)[1] = lStack_78;
          (*palVar11)[2] = lStack_70;
          (*palVar11)[3] = lStack_68;
          uVar25 = (ulong)((int)uVar25 + 1);
          uVar32 = uVar32 + 8;
        } while (uVar25 < matrix_width);
      }
      local_88 = local_88 + 1;
    } while (local_88 < graph->num_codes_);
  }
  ppNVar9 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar29 = (long)(graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar9;
  if (lVar29 != 0) {
    lVar10 = *(long *)&(((this->pimpl_)._M_t.
                         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         .
                         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                        ._M_head_impl)->node_id_to_rank).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    uVar25 = 0;
    do {
      *(int *)(lVar10 + (ulong)ppNVar9[uVar25]->id * 4) = (int)uVar25;
      uVar25 = uVar25 + 1;
    } while ((uVar25 & 0xffffffff) < (ulong)(lVar29 >> 3));
  }
  AVar6 = (this->super_AlignmentEngine).subtype_;
  if (AVar6 != kAffine) {
    if (AVar6 != kConvex) goto LAB_0010cf90;
    if (matrix_width != 0) {
      uVar25 = 0;
      do {
        palVar11 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->O + uVar25;
        (*palVar11)[0] = -0x7ffffbff7ffffc00;
        (*palVar11)[1] = -0x7ffffbff7ffffc00;
        (*palVar11)[2] = -0x7ffffbff7ffffc00;
        (*palVar11)[3] = -0x7ffffbff7ffffc00;
        alVar35 = (__mxxxi)vpbroadcastd_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->Q[uVar25] = alVar35;
        auVar36 = vpbroadcastd_avx512vl();
        iVar24 = 7;
        do {
          auVar16 = vperm2i128_avx2(auVar36,auVar36,0x28);
          auVar36 = vpalignr_avx2(auVar36,auVar16,0xc);
          palVar11 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->Q;
          alVar35 = (__mxxxi)vpaddd_avx2(auVar36,(undefined1  [32])palVar11[uVar25]);
          palVar11[uVar25] = alVar35;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
        uVar25 = uVar25 + 1;
      } while ((uVar25 & 0xffffffff) < matrix_width);
    }
    pIVar12 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
              ._M_head_impl;
    lVar29 = *(long *)&(pIVar12->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl
    ;
    *(undefined4 *)(lVar29 + matrix_height * 8) = 0;
    if (1 < matrix_height) {
      ppNVar9 = (graph->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar29 = lVar29 + matrix_height * 8;
      uVar25 = 1;
      do {
        pNVar13 = ppNVar9[(int)uVar25 - 1];
        ppEVar30 = (pNVar13->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar14 = *(pointer *)
                    ((long)&(pNVar13->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        iVar23 = (int)(this->super_AlignmentEngine).c_;
        iVar24 = (this->super_AlignmentEngine).q_ - iVar23;
        if (ppEVar30 != ppEVar14) {
          iVar24 = -0x7ffffc00;
          do {
            iVar7 = *(int *)(lVar29 + (ulong)(*(int *)(*(long *)&(pIVar12->node_id_to_rank).
                                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  + (ulong)(*ppEVar30)->tail->id * 4) + 1) * 4);
            if (iVar7 < iVar24) {
              iVar7 = iVar24;
            }
            iVar24 = iVar7;
            ppEVar30 = ppEVar30 + 1;
          } while (ppEVar30 != ppEVar14);
        }
        *(int *)(lVar29 + uVar25 * 4) = iVar24 + iVar23;
        uVar25 = (ulong)((int)uVar25 + 1);
      } while (uVar25 < matrix_height);
    }
  }
  if (matrix_width != 0) {
    uVar25 = 0;
    do {
      palVar11 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->F + uVar25;
      (*palVar11)[0] = -0x7ffffbff7ffffc00;
      (*palVar11)[1] = -0x7ffffbff7ffffc00;
      (*palVar11)[2] = -0x7ffffbff7ffffc00;
      (*palVar11)[3] = -0x7ffffbff7ffffc00;
      alVar35 = (__mxxxi)vpbroadcastd_avx512vl();
      ((this->pimpl_)._M_t.
       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       ._M_t.
       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       .
       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
      ._M_head_impl)->E[uVar25] = alVar35;
      auVar36 = vpbroadcastd_avx512vl();
      iVar24 = 7;
      do {
        auVar16 = vperm2i128_avx2(auVar36,auVar36,0x28);
        auVar36 = vpalignr_avx2(auVar36,auVar16,0xc);
        palVar11 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->E;
        alVar35 = (__mxxxi)vpaddd_avx2(auVar36,(undefined1  [32])palVar11[uVar25]);
        palVar11[uVar25] = alVar35;
        iVar24 = iVar24 + -1;
      } while (iVar24 != 0);
      uVar25 = uVar25 + 1;
    } while ((uVar25 & 0xffffffff) < matrix_width);
  }
  pIVar12 = (this->pimpl_)._M_t.
            super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            ._M_t.
            super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            .
            super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
            ._M_head_impl;
  lVar29 = *(long *)&(pIVar12->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  *(undefined4 *)(lVar29 + matrix_height * 4) = 0;
  if (1 < matrix_height) {
    lVar29 = lVar29 + matrix_height * 4;
    ppNVar9 = (graph->rank_to_node_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar25 = 1;
    do {
      pNVar13 = ppNVar9[(int)uVar25 - 1];
      ppEVar30 = (pNVar13->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar14 = *(pointer *)
                  ((long)&(pNVar13->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      iVar23 = (int)(this->super_AlignmentEngine).e_;
      iVar24 = (this->super_AlignmentEngine).g_ - iVar23;
      if (ppEVar30 != ppEVar14) {
        iVar24 = -0x7ffffc00;
        do {
          iVar7 = *(int *)(lVar29 + (ulong)(*(int *)(*(long *)&(pIVar12->node_id_to_rank).
                                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  + (ulong)(*ppEVar30)->tail->id * 4) + 1) * 4);
          if (iVar7 < iVar24) {
            iVar7 = iVar24;
          }
          iVar24 = iVar7;
          ppEVar30 = ppEVar30 + 1;
        } while (ppEVar30 != ppEVar14);
      }
      *(int *)(lVar29 + uVar25 * 4) = iVar24 + iVar23;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while (uVar25 < matrix_height);
  }
LAB_0010cf90:
  AVar8 = (this->super_AlignmentEngine).type_;
  if (AVar8 == kOV) {
    AVar6 = (this->super_AlignmentEngine).subtype_;
    if (AVar6 == kConvex) {
      if (matrix_width != 0) {
        uVar20 = 1;
        lVar29 = 0;
        do {
          pIVar12 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          auVar36 = vpmaxsd_avx2(*(undefined1 (*) [32])((long)*pIVar12->E + lVar29),
                                 *(undefined1 (*) [32])((long)*pIVar12->Q + lVar29));
          *(undefined1 (*) [32])((long)*pIVar12->H + lVar29) = auVar36;
          uVar25 = (ulong)uVar20;
          lVar29 = lVar29 + 0x20;
          uVar20 = uVar20 + 1;
        } while (uVar25 < matrix_width);
      }
    }
    else if (AVar6 == kAffine) {
      if (matrix_width != 0) {
        uVar20 = 1;
        lVar29 = 0;
        do {
          pIVar12 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          puVar1 = (undefined8 *)((long)*pIVar12->E + lVar29);
          uVar17 = puVar1[1];
          uVar18 = puVar1[2];
          uVar19 = puVar1[3];
          puVar2 = (undefined8 *)((long)*pIVar12->H + lVar29);
          *puVar2 = *puVar1;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          uVar25 = (ulong)uVar20;
          lVar29 = lVar29 + 0x20;
          uVar20 = uVar20 + 1;
        } while (uVar25 < matrix_width);
      }
    }
    else if ((AVar6 == kLinear) && (matrix_width != 0)) {
      uVar25 = 0;
      do {
        alVar35 = (__mxxxi)vpbroadcastd_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->H[uVar25] = alVar35;
        auVar36 = vpbroadcastd_avx512vl();
        iVar24 = 7;
        do {
          auVar16 = vperm2i128_avx2(auVar36,auVar36,0x28);
          auVar36 = vpalignr_avx2(auVar36,auVar16,0xc);
          palVar11 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H;
          alVar35 = (__mxxxi)vpaddd_avx2(auVar36,(undefined1  [32])palVar11[uVar25]);
          palVar11[uVar25] = alVar35;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
        uVar25 = uVar25 + 1;
      } while ((uVar25 & 0xffffffff) < matrix_width);
    }
    if (matrix_height != 0) {
      lVar29 = *(long *)&(((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->first_column).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      uVar25 = 0;
      do {
        *(undefined4 *)(lVar29 + uVar25 * 4) = 0;
        uVar25 = uVar25 + 1;
      } while ((uVar25 & 0xffffffff) < matrix_height);
    }
  }
  else if (AVar8 == kNW) {
    AVar6 = (this->super_AlignmentEngine).subtype_;
    if (AVar6 == kLinear) {
      pIVar12 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      puVar15 = *(undefined4 **)
                 &(pIVar12->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      *puVar15 = 0;
      if (1 < matrix_height) {
        ppNVar9 = (graph->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        cVar4 = (this->super_AlignmentEngine).g_;
        uVar25 = 1;
        do {
          pNVar13 = ppNVar9[(int)uVar25 - 1];
          ppEVar30 = (pNVar13->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar14 = *(pointer *)
                      ((long)&(pNVar13->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          iVar24 = -0x7ffffc00;
          if (ppEVar30 == ppEVar14) {
            iVar24 = 0;
          }
          else {
            do {
              iVar23 = puVar15[*(int *)(*(long *)&(pIVar12->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar30)->tail->id * 4) + 1];
              if ((int)puVar15[*(int *)(*(long *)&(pIVar12->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar30)->tail->id * 4) + 1] < iVar24) {
                iVar23 = iVar24;
              }
              iVar24 = iVar23;
              ppEVar30 = ppEVar30 + 1;
            } while (ppEVar30 != ppEVar14);
          }
          puVar15[uVar25] = iVar24 + cVar4;
          uVar25 = (ulong)((int)uVar25 + 1);
        } while (uVar25 < matrix_height);
      }
      if (matrix_width != 0) {
        uVar25 = 0;
        do {
          alVar35 = (__mxxxi)vpbroadcastd_avx512vl();
          ((this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           .
           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
          ._M_head_impl)->H[uVar25] = alVar35;
          auVar36 = vpbroadcastd_avx512vl();
          iVar24 = 7;
          do {
            auVar16 = vperm2i128_avx2(auVar36,auVar36,0x28);
            auVar36 = vpalignr_avx2(auVar36,auVar16,0xc);
            palVar11 = ((this->pimpl_)._M_t.
                        super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        .
                        super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                       ._M_head_impl)->H;
            alVar35 = (__mxxxi)vpaddd_avx2(auVar36,(undefined1  [32])palVar11[uVar25]);
            palVar11[uVar25] = alVar35;
            iVar24 = iVar24 + -1;
          } while (iVar24 != 0);
          uVar25 = uVar25 + 1;
        } while ((uVar25 & 0xffffffff) < matrix_width);
      }
    }
    else if (AVar6 == kConvex) {
      if (matrix_height != 0) {
        piVar21 = *(int **)&(((this->pimpl_)._M_t.
                              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              .
                              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                             ._M_head_impl)->first_column).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        uVar25 = 1;
        do {
          iVar24 = piVar21[matrix_height * 2];
          if (piVar21[matrix_height * 2] < piVar21[matrix_height]) {
            iVar24 = piVar21[matrix_height];
          }
          *piVar21 = iVar24;
          piVar21 = piVar21 + 1;
          bVar34 = uVar25 < matrix_height;
          uVar25 = (ulong)((int)uVar25 + 1);
        } while (bVar34);
      }
      if (matrix_width != 0) {
        uVar20 = 1;
        lVar29 = 0;
        do {
          pIVar12 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          auVar36 = vpmaxsd_avx2(*(undefined1 (*) [32])((long)*pIVar12->E + lVar29),
                                 *(undefined1 (*) [32])((long)*pIVar12->Q + lVar29));
          *(undefined1 (*) [32])((long)*pIVar12->H + lVar29) = auVar36;
          uVar25 = (ulong)uVar20;
          lVar29 = lVar29 + 0x20;
          uVar20 = uVar20 + 1;
        } while (uVar25 < matrix_width);
      }
    }
    else if (AVar6 == kAffine) {
      if (matrix_height != 0) {
        lVar29 = *(long *)&(((this->pimpl_)._M_t.
                             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             .
                             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                            ._M_head_impl)->first_column).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl;
        uVar25 = 0;
        do {
          *(undefined4 *)(lVar29 + uVar25 * 4) =
               *(undefined4 *)(lVar29 + matrix_height * 4 + uVar25 * 4);
          uVar25 = uVar25 + 1;
        } while ((uVar25 & 0xffffffff) < matrix_height);
      }
      if (matrix_width != 0) {
        uVar20 = 1;
        lVar29 = 0;
        do {
          pIVar12 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          puVar1 = (undefined8 *)((long)*pIVar12->E + lVar29);
          uVar17 = puVar1[1];
          uVar18 = puVar1[2];
          uVar19 = puVar1[3];
          puVar2 = (undefined8 *)((long)*pIVar12->H + lVar29);
          *puVar2 = *puVar1;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          uVar25 = (ulong)uVar20;
          lVar29 = lVar29 + 0x20;
          uVar20 = uVar20 + 1;
        } while (uVar25 < matrix_width);
      }
    }
  }
  else if (AVar8 == kSW) {
    if (matrix_width != 0) {
      uVar20 = 1;
      lVar29 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)*((this->pimpl_)._M_t.
                          super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          .
                          super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                         ._M_head_impl)->H + lVar29);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        uVar25 = (ulong)uVar20;
        lVar29 = lVar29 + 0x20;
        uVar20 = uVar20 + 1;
      } while (uVar25 < matrix_width);
    }
    if (matrix_height != 0) {
      lVar29 = *(long *)&(((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->first_column).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      uVar25 = 0;
      do {
        *(undefined4 *)(lVar29 + uVar25 * 4) = 0;
        uVar25 = uVar25 + 1;
      } while ((uVar25 & 0xffffffff) < matrix_height);
    }
  }
  return;
}

Assistant:

void SimdAlignmentEngine<A>::Initialize(
    const char* sequence,
    const Graph& graph,
    std::uint64_t normal_matrix_width,
    std::uint64_t matrix_width,
    std::uint64_t matrix_height) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::int32_t padding_penatly = -1 * std::max(
      std::max(abs(m_), abs(n_)),
      std::max(abs(g_), abs(q_)));

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {};  // NOLINT

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    for (std::uint32_t j = 0; j < matrix_width; ++j) {
      for (std::uint32_t k = 0; k < T::kNumVar; ++k) {
        unpacked[k] = (j * T::kNumVar + k) < normal_matrix_width ?
            (c == sequence[j * T::kNumVar + k] ? m_ : n_) : padding_penatly;
      }
      pimpl_->sequence_profile[i * matrix_width + j] =
          _mmxxx_load_si(reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __mxxxi negative_infinities = T::_mmxxx_set1_epi(kNegativeInfinity);
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->O[j] = negative_infinities;
        pimpl_->Q[j] = T::_mmxxx_set1_epi(q_ + j * T::kNumVar * c_);

        __mxxxi c = T::_mmxxx_set1_epi(c_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          c = _mmxxx_slli_si(c, T::kLSS);
          pimpl_->Q[j] = T::_mmxxx_add_epi(pimpl_->Q[j], c);
        }
      }
      pimpl_->first_column[2 * matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[2 * matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[2 * matrix_height + i] = penalty + c_;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->F[j] = negative_infinities;
        pimpl_->E[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * e_);

        __mxxxi e = T::_mmxxx_set1_epi(e_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          e = _mmxxx_slli_si(e, T::kLSS);
          pimpl_->E[j] = T::_mmxxx_add_epi(pimpl_->E[j], e);
        }
      }
      pimpl_->first_column[matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[matrix_height + i] = penalty + e_;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->H[j] = zeroes;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = std::max(
                pimpl_->first_column[matrix_height + i],
                pimpl_->first_column[2 * matrix_height + i]);
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j], pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = pimpl_->first_column[matrix_height + i];
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          pimpl_->first_column[0] = 0;
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->first_column[pred_i]);
            }
            pimpl_->first_column[i] = penalty + g_;
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j],
            pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    default:
      break;
  }
#endif
  (void) sequence;
  (void) graph;
  (void) normal_matrix_width;
  (void) matrix_width;
  (void) matrix_height;
}